

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O0

int my_trace(CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  char *local_48;
  char *text;
  data *config;
  void *userp_local;
  size_t size_local;
  char *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"== Info: %s",data);
    return 0;
  case CURLINFO_HEADER_IN:
    local_48 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    local_48 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    local_48 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    local_48 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    local_48 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    local_48 = "=> Send SSL data";
    break;
  default:
    goto switchD_00102562_default;
  }
  dump(local_48,_stderr,(uchar *)data,size,*userp);
switchD_00102562_default:
  return 0;
}

Assistant:

static
int my_trace(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp)
{
  struct data *config = (struct data *)userp;
  const char *text;
  (void)handle; /* prevent compiler warning */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "== Info: %s", (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  dump(text, stderr, (unsigned char *)data, size, config->trace_ascii);
  return 0;
}